

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_AST.h
# Opt level: O0

void __thiscall
soul::heart::StructElement::StructElement
          (StructElement *this,CodeLocation *l,Expression *v,string *member)

{
  string_view memberName;
  bool bVar1;
  Type *pTVar2;
  Structure *this_00;
  bool local_89;
  CodeLocation local_38;
  string *local_28;
  string *member_local;
  Expression *v_local;
  CodeLocation *l_local;
  StructElement *this_local;
  
  local_28 = member;
  member_local = (string *)v;
  v_local = (Expression *)l;
  l_local = (CodeLocation *)this;
  CodeLocation::CodeLocation(&local_38,l);
  Expression::Expression(&this->super_Expression,&local_38);
  CodeLocation::~CodeLocation(&local_38);
  (this->super_Expression).super_Object._vptr_Object = (_func_int **)&PTR__StructElement_0058b260;
  pool_ref<soul::heart::Expression>::pool_ref<soul::heart::Expression,void>
            (&this->parent,(Expression *)member_local);
  std::__cxx11::string::string((string *)&this->memberName,(string *)member);
  pTVar2 = (Type *)(**(code **)(*(long *)member_local + 0x10))();
  bVar1 = Type::isStruct(pTVar2);
  local_89 = false;
  if (bVar1) {
    pTVar2 = (Type *)(**(code **)(*(long *)member_local + 0x10))();
    this_00 = Type::getStructRef(pTVar2);
    memberName = (string_view)
                 std::__cxx11::string::operator_cast_to_basic_string_view
                           ((string *)&this->memberName);
    local_89 = Structure::hasMemberWithName(this_00,memberName);
  }
  checkAssertion(local_89,
                 "v.getType().isStruct() && v.getType().getStructRef().hasMemberWithName (memberName)"
                 ,"StructElement",0x283);
  return;
}

Assistant:

StructElement (CodeLocation l, Expression& v, std::string member)
           : Expression (std::move (l)), parent (v), memberName (std::move (member))
        {
            SOUL_ASSERT (v.getType().isStruct() && v.getType().getStructRef().hasMemberWithName (memberName));
        }